

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O1

void __thiscall
Atari::ST::ConcreteMachine::ConcreteMachine
          (ConcreteMachine *this,Target *target,ROMFetcher *rom_fetcher)

{
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *this_00;
  AsyncTaskQueue<false,_true,_void> *this_01;
  AY38910<false> *sample_source;
  atomic_flag *paVar1;
  Observer *pOVar2;
  ACIA *this_02;
  ACIA *this_03;
  Source *pSVar3;
  MFP68901 *this_04;
  DMAController *this_05;
  __atomic_flag_data_type _Var4;
  uint8_t *buffer;
  HalfCycles HVar5;
  uint16_t *ram;
  pointer puVar6;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *pJVar7;
  bool bVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  long lVar11;
  undefined4 *puVar12;
  char *__function;
  size_type __new_size;
  ulong uVar13;
  ulong uVar14;
  _Base_ptr p_Var15;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  local_118;
  Video *local_108;
  _Any_data *local_100;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *local_f8;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *local_d8;
  LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *local_d0;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *local_c8;
  Target *local_c0;
  undefined1 local_b8 [8];
  _Head_base<0UL,_Atari::ST::Video_*,_false> _Stack_b0;
  _Base_ptr local_a8;
  _Base_ptr p_Stack_a0;
  _Base_ptr local_98;
  size_t sStack_90;
  IntelligentKeyboard *local_88;
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *local_80;
  AsyncTaskQueue<false,_true,_void> *local_78;
  RangeObserver *local_70;
  PortHandler *local_68;
  Delegate *local_60;
  Request local_58;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_0059e028;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00593df0;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00598440;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_005983e0;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&PTR___cxa_pure_virtual_00598428;
  (this->super_JoystickMachine)._vptr_JoystickMachine =
       (_func_int **)&PTR___cxa_pure_virtual_005983f8;
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  _Stack_b0._M_head_impl = (Video *)0x0;
  sStack_90 = 0;
  local_c0 = target;
  p_Stack_a0 = (_Base_ptr)&_Stack_b0;
  local_98 = (_Base_ptr)&_Stack_b0;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_b8);
  local_100 = (_Any_data *)rom_fetcher;
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_b8);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059dbc8;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059dc90;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059dcd8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059dd10;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&DAT_0059dd28;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059dd40;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059dd58;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059dd88;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059ddc8;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_0059dde0;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_0059ddf8;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_0059de10;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_0059de28;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0059de40;
  (this->super_PortHandler)._vptr_PortHandler = (_func_int **)&PTR_get_port_input_0059de58;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059de78;
  (this->super_RangeObserver)._vptr_RangeObserver = (_func_int **)&DAT_0059de98;
  CPU::MC68000::ProcessorBase::ProcessorBase(&(this->mc68000_).super_ProcessorBase);
  (this->mc68000_).bus_handler_ = this;
  (this->bus_phase_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059e0c8;
  local_108 = &(this->video_).object_;
  ST::Video::Video(local_108);
  (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).is_flushed_ = true;
  (this->video_).did_flush_ = false;
  (this->video_).clocking_preference_ = JustInTime;
  (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  local_c8 = (JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)&this->mfp_;
  local_d8 = &this->video_;
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::JustInTimeActor<>
            ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)local_c8)
  ;
  this_00 = &this->keyboard_acia_;
  local_b8 = (undefined1  [8])0x7a120;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            (this_00,(Cycles *)local_b8);
  local_f0 = &this->midi_acia_;
  local_b8 = (undefined1  [8])0x7a120;
  local_f8 = this_00;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            (local_f0,(Cycles *)local_b8);
  this_01 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_01);
  sample_source = &this->ay_;
  local_78 = this_01;
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            (&sample_source->super_AY38910SampleSource<false>,YM2149F,this_01);
  (this->ay_).super_SampleSource<GI::AY38910::AY38910<false>,_false,_4>.master_divider_ = 0;
  local_d0 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>;
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            ((PullLowpass<GI::AY38910::AY38910<false>_> *)local_d0,sample_source);
  (this->cycles_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  local_80 = &this->dma_;
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::JustInTimeActor<>(local_80);
  (this->cycles_since_ikbd_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  LOCK();
  paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
  _Var4 = (paVar1->super___atomic_flag_base)._M_i;
  (paVar1->super___atomic_flag_base)._M_i = true;
  UNLOCK();
  if (_Var4 == false) {
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(this_00);
    LOCK();
    (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    LOCK();
    paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
    _Var4 = (paVar1->super___atomic_flag_base)._M_i;
    (paVar1->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var4 == false) {
      JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(this_00);
      LOCK();
      (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
      UNLOCK();
      local_88 = &this->ikbd_;
      IntelligentKeyboard::IntelligentKeyboard
                (local_88,&(this->keyboard_acia_).object_.transmit,
                 &(this->keyboard_acia_).object_.receive);
      local_e0 = &this->ram_;
      local_e8 = &this->rom_;
      (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this->rom_start_ = 0;
      this->may_defer_acias_ = true;
      this->keyboard_needs_clock_ = false;
      this->mfp_is_realtime_ = false;
      this->dma_clocking_preference_ = None;
      this->video_interrupts_pending_ = 0;
      this->previous_hsync_ = false;
      this->previous_vsync_ = false;
      (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
           (_func_int **)&PTR_mapped_key_for_key_0059e5f8;
      (this->super_TimedMachine).clock_rate_ = 8021247.0;
      Outputs::Speaker::
      LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>::
      set_input_rate(local_d0,2005311.8);
      __new_size = 0x400000;
      if (local_c0->memory_size != FourMegabytes) {
        __new_size = (ulong)(local_c0->memory_size == OneMegabyte) * 0x80000 + 0x80000;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_e0,__new_size);
      buffer = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Memory::Fuzz(buffer,(long)(this->ram_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)buffer);
      LOCK();
      paVar1 = &(this->video_).flush_concurrency_check_;
      _Var4 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var4 != false) {
LAB_00303050:
        __function = 
        "auto JustInTimeActor<Atari::ST::Video>::operator->() [T = Atari::ST::Video, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
        ;
        goto LAB_00303093;
      }
      if ((this->video_).is_flushed_ == false) {
        (this->video_).is_flushed_ = true;
        (this->video_).did_flush_ = true;
        HVar5.super_WrappedInt<HalfCycles>.length_ =
             (WrappedInt<HalfCycles>)
             (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
        (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
        ST::Video::run_for(local_108,HVar5);
      }
      LOCK();
      (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
      UNLOCK();
      _Stack_b0._M_head_impl = local_108;
      ram = (uint16_t *)
            (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      local_b8 = (undefined1  [8])&this->video_;
      ST::Video::set_ram(local_108,ram,
                         (ulong)((long)(this->ram_).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ram) >> 1)
      ;
      std::
      unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_b8);
      ROM::Request::Request(&local_58,AtariSTTOS100,false);
      if (*(long *)(local_100 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)((long)local_100 + 0x18))
                ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)local_b8,local_100,&local_58);
      bVar8 = ROM::Request::validate(&local_58,(Map *)local_b8);
      p_Var10 = (_Base_ptr)&_Stack_b0;
      p_Var15 = local_a8;
      if (!bVar8) {
        puVar12 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar12 = 0;
        __cxa_throw(puVar12,&ROMMachine::Error::typeinfo,0);
      }
      for (; p_Var15 != (_Base_ptr)0x0;
          p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < 0x26]) {
        if (0x25 < (int)p_Var15[1]._M_color) {
          p_Var10 = p_Var15;
        }
      }
      p_Var15 = (_Base_ptr)&_Stack_b0;
      if ((p_Var10 != (_Base_ptr)&_Stack_b0) && ((int)p_Var10[1]._M_color < 0x27)) {
        p_Var15 = p_Var10;
      }
      Memory::PackBigEndian16
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var15[1]._M_parent,
                 local_e8);
      puVar6 = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar6;
      uVar14 = uVar13 >> 0x10;
      uVar9 = (uint)(uVar13 >> 0x10);
      if ((int)uVar9 < 1) {
        uVar14 = 0;
      }
      else {
        memset(this->memory_map_,0,(ulong)(uVar9 & 0x7fffffff) << 2);
      }
      uVar9 = (uint)uVar14;
      if (uVar9 < 0x40) {
        uVar14 = uVar14 & 0xffffffff;
        do {
          this->memory_map_[uVar14] = Floating;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 0x40);
        uVar9 = 0x40;
      }
      if (uVar9 < 0xff) {
        uVar14 = (ulong)uVar9;
        do {
          this->memory_map_[uVar14] = Unassigned;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 0xff);
      }
      pOVar2 = &this->super_Observer;
      local_100 = (_Any_data *)&this->super_InterruptDelegate;
      local_60 = &this->super_Delegate;
      local_68 = &this->super_PortHandler;
      local_70 = &this->super_RangeObserver;
      this_02 = &(this->keyboard_acia_).object_;
      this->rom_start_ = 0xfc0000;
      lVar11 = 0xa5d;
      do {
        *(undefined4 *)((long)&(this->super_Machine)._vptr_Machine + lVar11 * 4) = 2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0xa60);
      this->memory_map_[0xfa] = Cartridge;
      this->memory_map_[0xfb] = Cartridge;
      this->memory_map_[0xff] = IO;
      *(undefined8 *)puVar6 =
           *(undefined8 *)
            (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      LOCK();
      paVar1 = &(this->midi_acia_).flush_concurrency_check_;
      _Var4 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var4 == false) {
        JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(local_f0);
        LOCK();
        (this->midi_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        this_03 = &(this->midi_acia_).object_;
        Motorola::ACIA::ACIA::set_interrupt_delegate(this_03,&this->super_InterruptDelegate);
        LOCK();
        paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
        _Var4 = (paVar1->super___atomic_flag_base)._M_i;
        (paVar1->super___atomic_flag_base)._M_i = true;
        UNLOCK();
        if (_Var4 == false) {
          JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(local_f8);
          LOCK();
          (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
          UNLOCK();
          Motorola::ACIA::ACIA::set_interrupt_delegate(this_02,&this->super_InterruptDelegate);
          LOCK();
          paVar1 = &(this->midi_acia_).flush_concurrency_check_;
          _Var4 = (paVar1->super___atomic_flag_base)._M_i;
          (paVar1->super___atomic_flag_base)._M_i = true;
          UNLOCK();
          if (_Var4 == false) {
            JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(local_f0);
            LOCK();
            (this->midi_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
            UNLOCK();
            (this->midi_acia_).object_.super_Source.observer_ = pOVar2;
            uVar9 = (**(this->midi_acia_).object_.super_Source._vptr_Source)(this_03);
            (**pOVar2->_vptr_Observer)(pOVar2,this_03,(ulong)uVar9);
            pJVar7 = local_d8;
            LOCK();
            paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
            _Var4 = (paVar1->super___atomic_flag_base)._M_i;
            (paVar1->super___atomic_flag_base)._M_i = true;
            UNLOCK();
            if (_Var4 == false) {
              JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(local_f8);
              LOCK();
              (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
              UNLOCK();
              (this->keyboard_acia_).object_.super_Source.observer_ = pOVar2;
              uVar9 = (**(this->keyboard_acia_).object_.super_Source._vptr_Source)(this_02);
              (**pOVar2->_vptr_Observer)(pOVar2,this_02,(ulong)uVar9);
              pSVar3 = &(this->ikbd_).super_Source;
              (this->ikbd_).super_Source.observer_ = pOVar2;
              uVar9 = (**(this->ikbd_).super_Source._vptr_Source)(pSVar3);
              (**pOVar2->_vptr_Observer)(pOVar2,pSVar3,(ulong)uVar9);
              LOCK();
              paVar1 = &(this->mfp_).flush_concurrency_check_;
              _Var4 = (paVar1->super___atomic_flag_base)._M_i;
              (paVar1->super___atomic_flag_base)._M_i = true;
              UNLOCK();
              if (_Var4 == false) {
                if ((this->mfp_).is_flushed_ == false) {
                  (this->mfp_).is_flushed_ = true;
                  (this->mfp_).did_flush_ = true;
                  uVar14 = (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                  (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
                       (long)uVar14 % 0x28cc55;
                  if (0x28cc54 < (long)uVar14) {
                    Motorola::MFP68901::MFP68901::run_for
                              (&(this->mfp_).object_,(HalfCycles)(uVar14 / 0x28cc55));
                  }
                }
                LOCK();
                (this->mfp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                UNLOCK();
                this_04 = &(this->mfp_).object_;
                local_118._M_t.
                super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                ._M_t.
                super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                .
                super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                .
                super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                ._M_head_impl.actor_ =
                     (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                      )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                        )local_c8;
                (this->mfp_).object_.super_Source.observer_ = pOVar2;
                local_118._M_t.
                super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                ._M_t.
                super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                .super__Head_base<0UL,_Atari::ST::Video_*,_false>._M_head_impl = (Video *)this_04;
                uVar9 = (**(this->mfp_).object_.super_Source._vptr_Source)(this_04);
                (**pOVar2->_vptr_Observer)(pOVar2,this_04,(ulong)uVar9);
                std::
                unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                               *)&local_118);
                LOCK();
                paVar1 = &(this->dma_).flush_concurrency_check_;
                _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                (paVar1->super___atomic_flag_base)._M_i = true;
                UNLOCK();
                if (_Var4 == false) {
                  if ((this->dma_).is_flushed_ == false) {
                    (this->dma_).is_flushed_ = true;
                    (this->dma_).did_flush_ = true;
                    HVar5.super_WrappedInt<HalfCycles>.length_ =
                         (WrappedInt<HalfCycles>)
                         (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                    (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
                    DMAController::run_for(&(this->dma_).object_,HVar5);
                  }
                  LOCK();
                  (this->dma_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                  UNLOCK();
                  pSVar3 = &(this->dma_).object_.super_Source;
                  (this->dma_).object_.super_Source.observer_ = pOVar2;
                  uVar9 = (**(this->dma_).object_.super_Source._vptr_Source)(pSVar3);
                  (**pOVar2->_vptr_Observer)(pOVar2,pSVar3,(ulong)uVar9);
                  LOCK();
                  paVar1 = &(this->mfp_).flush_concurrency_check_;
                  _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                  (paVar1->super___atomic_flag_base)._M_i = true;
                  UNLOCK();
                  if (_Var4 != false) goto LAB_00303067;
                  if ((this->mfp_).is_flushed_ == false) {
                    (this->mfp_).is_flushed_ = true;
                    (this->mfp_).did_flush_ = true;
                    uVar14 = (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                    (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
                         (long)uVar14 % 0x28cc55;
                    if (0x28cc54 < (long)uVar14) {
                      Motorola::MFP68901::MFP68901::run_for(this_04,(HalfCycles)(uVar14 / 0x28cc55))
                      ;
                    }
                  }
                  LOCK();
                  (this->mfp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                  UNLOCK();
                  local_118._M_t.
                  super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  .
                  super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  .
                  super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                  ._M_head_impl.actor_ =
                       (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                        )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                          )local_c8;
                  local_118._M_t.
                  super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  .super__Head_base<0UL,_Atari::ST::Video_*,_false>._M_head_impl = (Video *)this_04;
                  Motorola::MFP68901::MFP68901::set_interrupt_delegate
                            (this_04,(InterruptDelegate *)local_100);
                  std::
                  unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                  ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                                 *)&local_118);
                  LOCK();
                  paVar1 = &(this->dma_).flush_concurrency_check_;
                  _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                  (paVar1->super___atomic_flag_base)._M_i = true;
                  UNLOCK();
                  if (_Var4 == false) {
                    this_05 = &(this->dma_).object_;
                    if ((this->dma_).is_flushed_ == false) {
                      (this->dma_).is_flushed_ = true;
                      (this->dma_).did_flush_ = true;
                      HVar5.super_WrappedInt<HalfCycles>.length_ =
                           (WrappedInt<HalfCycles>)
                           (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                      (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
                      DMAController::run_for(this_05,HVar5);
                    }
                    LOCK();
                    (this->dma_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                    UNLOCK();
                    DMAController::set_delegate(this_05,local_60);
                    GI::AY38910::AY38910SampleSource<false>::set_port_handler
                              (&sample_source->super_AY38910SampleSource<false>,local_68);
                    set_gpip_input(this);
                    LOCK();
                    paVar1 = &(this->video_).flush_concurrency_check_;
                    _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                    (paVar1->super___atomic_flag_base)._M_i = true;
                    UNLOCK();
                    if (_Var4 == false) {
                      if ((this->video_).is_flushed_ == false) {
                        (this->video_).is_flushed_ = true;
                        (this->video_).did_flush_ = true;
                        HVar5.super_WrappedInt<HalfCycles>.length_ =
                             (WrappedInt<HalfCycles>)
                             (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                        (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
                        ST::Video::run_for(local_108,HVar5);
                      }
                      LOCK();
                      (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                      UNLOCK();
                      local_118._M_t.
                      super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      .
                      super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      .
                      super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                      ._M_head_impl.actor_ =
                           (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                            )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                              )pJVar7;
                      local_118._M_t.
                      super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      .super__Head_base<0UL,_Atari::ST::Video_*,_false>._M_head_impl = local_108;
                      ST::Video::set_range_observer(local_108,local_70);
                      std::
                      unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      ::~unique_ptr(&local_118);
                      insert_media(this,&(local_c0->super_Target).media);
                      std::
                      _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                   *)local_b8);
                      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
                                (&local_58.node.children);
                      return;
                    }
                    goto LAB_00303050;
                  }
                }
                __function = 
                "auto JustInTimeActor<Atari::ST::DMAController>::operator->() [T = Atari::ST::DMAController, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                ;
              }
              else {
LAB_00303067:
                __function = 
                "auto JustInTimeActor<Motorola::MFP68901::MFP68901, HalfCycles, 819200, 2673749>::operator->() [T = Motorola::MFP68901::MFP68901, LocalTimeScale = HalfCycles, multiplier = 819200, divider = 2673749]"
                ;
              }
              goto LAB_00303093;
            }
          }
        }
      }
    }
  }
  __function = 
  "auto JustInTimeActor<Motorola::ACIA::ACIA, HalfCycles, 16>::operator->() [T = Motorola::ACIA::ACIA, LocalTimeScale = HalfCycles, multiplier = 16, divider = 1]"
  ;
LAB_00303093:
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                ,0x7e,__function);
}

Assistant:

ConcreteMachine(const Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			mc68000_(*this),
			keyboard_acia_(Cycles(500000)),
			midi_acia_(Cycles(500000)),
			ay_(GI::AY38910::Personality::YM2149F, audio_queue_),
			speaker_(ay_),
			ikbd_(keyboard_acia_->transmit, keyboard_acia_->receive) {
			set_clock_rate(CLOCK_RATE);
			speaker_.set_input_rate(float(CLOCK_RATE) / 4.0f);

			switch(target.memory_size) {
				default:
				case Target::MemorySize::FiveHundredAndTwelveKilobytes:
					ram_.resize(512 * 1024);
				break;
				case Target::MemorySize::OneMegabyte:
					ram_.resize(1024 * 1024);
				break;
				case Target::MemorySize::FourMegabytes:
					ram_.resize(4 * 1024 * 1024);
				break;
			}
			Memory::Fuzz(ram_);

			video_->set_ram(
				reinterpret_cast<uint16_t *>(ram_.data()),
				ram_.size() >> 1
			);

			constexpr ROM::Name rom_name = ROM::Name::AtariSTTOS100;
			ROM::Request request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}
			Memory::PackBigEndian16(roms.find(rom_name)->second, rom_);

			// Set up basic memory map.
			int c = 0;
			for(; c < int(ram_.size() >> 16); ++c) memory_map_[c] = BusDevice::RAM;
			for(; c < 0x40; ++c) memory_map_[c] = BusDevice::Floating;
			for(; c < 0xff; ++c) memory_map_[c] = BusDevice::Unassigned;

			const bool is_early_tos = true;
			if(is_early_tos) {
				rom_start_ = 0xfc0000;
				for(c = 0xfc; c < 0xff; ++c) memory_map_[c] = BusDevice::ROM;
			} else {
				rom_start_ = 0xe00000;
				for(c = 0xe0; c < 0xe4; ++c) memory_map_[c] = BusDevice::ROM;
			}

			memory_map_[0xfa] = memory_map_[0xfb] = BusDevice::Cartridge;
			memory_map_[0xff] = BusDevice::IO;

			// Copy the first 8 bytes of ROM into RAM.
			reinstall_rom_vector();

			midi_acia_->set_interrupt_delegate(this);
			keyboard_acia_->set_interrupt_delegate(this);

			midi_acia_->set_clocking_hint_observer(this);
			keyboard_acia_->set_clocking_hint_observer(this);
			ikbd_.set_clocking_hint_observer(this);
			mfp_->set_clocking_hint_observer(this);
			dma_->set_clocking_hint_observer(this);

			mfp_->set_interrupt_delegate(this);
			dma_->set_delegate(this);
			ay_.set_port_handler(this);

			set_gpip_input();

			video_->set_range_observer(this);

			// Insert any supplied media.
			insert_media(target.media);
		}